

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_wiz.c
# Opt level: O2

void do_racedump(CHAR_DATA *ch,char *argument)

{
  char *pcVar1;
  long lVar2;
  FILE *__stream;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  char buf [4608];
  
  __stream = fopen("../logs/racdump.txt","w");
  lVar3 = 0;
  uVar5 = 0;
  while( true ) {
    pcVar1 = race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5].name;
    if (pcVar1 == (char *)0x0) break;
    fprintf(__stream,";%s;%s;%s;%s;",pcVar1,pcVar1,pcVar1,pcVar1);
    fprintf(__stream," %d;",
            (ulong)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar5].pc_race);
    uVar6 = 0;
    for (lVar4 = 2; lVar4 != 0xc; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->act +
                       lVar4 * 8 + lVar3 + -0x10);
      if (lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        uVar6 = uVar6 | (long)dVar7;
      }
    }
    fprintf(__stream," %ld;",uVar6);
    uVar6 = 0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->aff + lVar4 * 8 + lVar3);
      if (lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        uVar6 = uVar6 | (long)dVar7;
      }
    }
    fprintf(__stream," %ld;",uVar6);
    uVar6 = 0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->off + lVar4 * 8 + lVar3);
      if (lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        uVar6 = uVar6 | (long)dVar7;
      }
    }
    fprintf(__stream," %ld;",uVar6);
    uVar6 = 0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->imm + lVar4 * 8 + lVar3);
      if (lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        uVar6 = uVar6 | (long)dVar7;
      }
    }
    fprintf(__stream," %ld;",uVar6);
    uVar6 = 0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->res + lVar4 * 8 + lVar3);
      if (lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        uVar6 = uVar6 | (long)dVar7;
      }
    }
    fprintf(__stream," %ld;",uVar6);
    uVar6 = 0;
    for (lVar4 = 0; lVar4 != 10; lVar4 = lVar4 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->vuln + lVar4 * 8 + lVar3);
      if (lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        uVar6 = uVar6 | (long)dVar7;
      }
    }
    fprintf(__stream," %ld;",uVar6);
    lVar4 = 0;
    for (uVar6 = 0; uVar6 != 0xf; uVar6 = uVar6 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->form + uVar6 * 8 + lVar3);
      if (lVar2 < 0x1c && lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        lVar4 = lVar4 + (long)dVar7;
        dVar7 = exp2((double)*(long *)((long)(race_table.
                                              super__Vector_base<race_type,_std::allocator<race_type>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->parts +
                                      uVar6 * 8 + lVar3));
        sprintf(buf,"(FORM) %d-%d = %ld\n\r",uVar5 & 0xffffffff,uVar6 & 0xffffffff,(long)dVar7);
        send_to_char(buf,ch);
      }
    }
    fprintf(__stream," %ld;",lVar4);
    lVar4 = 0;
    for (uVar6 = 0; uVar6 != 0xf; uVar6 = uVar6 + 1) {
      lVar2 = *(long *)((long)(race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                               _M_impl.super__Vector_impl_data._M_start)->parts + uVar6 * 8 + lVar3)
      ;
      if (lVar2 < 0x1c && lVar2 != -99) {
        dVar7 = exp2((double)lVar2);
        lVar4 = lVar4 + (long)dVar7;
        dVar7 = exp2((double)*(long *)((long)(race_table.
                                              super__Vector_base<race_type,_std::allocator<race_type>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->parts +
                                      uVar6 * 8 + lVar3));
        sprintf(buf,"(PARTS) %d-%d = %ld\n\r",uVar5 & 0xffffffff,uVar6 & 0xffffffff,(long)dVar7);
        send_to_char(buf,ch);
      }
    }
    fprintf(__stream," %ld;",lVar4);
    fprintf(__stream," %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n",
            (ulong)(uint)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar5].arms,
            (ulong)(uint)race_table.super__Vector_base<race_type,_std::allocator<race_type>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar5].legs);
    uVar5 = uVar5 + 1;
    lVar3 = lVar3 + 0x2e8;
  }
  fclose(__stream);
  return;
}

Assistant:

void do_racedump(CHAR_DATA *ch, char *argument)
{
	FILE *fp = fopen(RACE_DUMP_FILE, "w");
	int race = 0, i = 0;
	long temp_bit = 0;
	char buf[MSL];

	for (race = 0; race_table[race].name != nullptr; race++)
	{
		fprintf(fp, ";%s;%s;%s;%s;", race_table[race].name, race_table[race].name, race_table[race].name, race_table[race].name);
		fprintf(fp, " %d;", race_table[race].pc_race);

		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].act[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].act[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].aff[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].aff[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].off[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].off[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].imm[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].imm[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].res[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].res[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 10; i++)
		{
			if (race_table[race].vuln[i] != NO_FLAG)
				SET_BIT_OLD(temp_bit, race_table[race].vuln[i]);
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].form[i] != NO_FLAG && race_table[race].form[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].form[i]);
				sprintf(buf, "(FORM) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		temp_bit = 0;

		for (i = 0; i < 15; i++)
		{
			if (race_table[race].parts[i] != NO_FLAG && race_table[race].parts[i] < ASCII_cc)
			{
				temp_bit += (long int)pow(2, race_table[race].parts[i]);
				sprintf(buf, "(PARTS) %d-%d = %ld\n\r", race, i, (long int)pow(2, race_table[race].parts[i]));
				send_to_char(buf, ch);
			}
		}

		fprintf(fp, " %ld;", temp_bit);
		fprintf(fp, " %d; %d; 0; 0; 0; 0; 0; 25; 25; 25; 25; 25;\n", race_table[race].arms, race_table[race].legs);
	}

	fclose(fp);
}